

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

double ON_SolveNxN(bool bFullPivot,bool bNormalize,int n,double **M,double *B,double *X)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  int *memblock;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int Xdex_buffer [64];
  
  dVar18 = 0.0;
  if ((X != (double *)0x0 && 0 < n) && (B != (double *)0x0 && M != (double **)0x0)) {
    uVar17 = (ulong)(uint)n;
    if (bNormalize) {
      for (uVar16 = 0; uVar16 != uVar17; uVar16 = uVar16 + 1) {
        dVar18 = 0.0;
        for (uVar4 = 0; uVar17 != uVar4; uVar4 = uVar4 + 1) {
          dVar18 = dVar18 + M[uVar16][uVar4] * M[uVar16][uVar4];
        }
        if (0.0 < dVar18) {
          if (dVar18 < 0.0) {
            dVar18 = sqrt(dVar18);
          }
          else {
            dVar18 = SQRT(dVar18);
          }
          B[uVar16] = B[uVar16] * (1.0 / dVar18);
          for (uVar4 = 0; uVar17 != uVar4; uVar4 = uVar4 + 1) {
            M[uVar16][uVar4] = M[uVar16][uVar4] * (1.0 / dVar18);
          }
        }
      }
    }
    memblock = Xdex_buffer;
    if (bFullPivot) {
      if (0x40 < n) {
        memblock = (int *)onmalloc(uVar17 * 4);
      }
      for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
        memblock[uVar16] = (int)uVar16;
      }
    }
    else {
      memblock = (int *)0x0;
    }
    lVar6 = 1;
    lVar5 = 0;
    dVar21 = 1.0;
    lVar7 = lVar6;
    dVar18 = 0.0;
    for (uVar16 = 0; uVar4 = uVar17, uVar16 != uVar17; uVar16 = uVar16 + 1) {
      dVar20 = 0.0;
      iVar15 = (int)uVar16;
      uVar4 = uVar16 & 0xffffffff;
      uVar9 = uVar16 & 0xffffffff;
      uVar13 = uVar16;
      do {
        uVar8 = (uint)uVar9;
        uVar10 = (uint)uVar4;
        uVar14 = uVar16;
        if (uVar13 == uVar17) break;
        while( true ) {
          uVar8 = (uint)uVar9;
          uVar10 = (uint)uVar4;
          if (uVar17 == uVar14) break;
          if (dVar20 < ABS(M[uVar14][uVar13])) {
            uVar4 = uVar14 & 0xffffffff;
            uVar9 = uVar13 & 0xffffffff;
            dVar20 = ABS(M[uVar14][uVar13]);
          }
          uVar14 = uVar14 + 1;
        }
        uVar13 = uVar13 + 1;
      } while (bFullPivot);
      if ((dVar20 == 0.0) && (!NAN(dVar20))) {
        if (memblock != Xdex_buffer && memblock != (int *)0x0) {
          onfree(memblock);
        }
        return (double)-iVar15;
      }
      dVar19 = dVar20;
      if ((uVar16 == 0) || ((dVar18 <= dVar20 && (dVar19 = dVar18, dVar21 < dVar20)))) {
        dVar21 = dVar20;
      }
      if (uVar16 != uVar10) {
        pdVar2 = M[uVar16];
        M[uVar16] = M[(int)uVar10];
        M[(int)uVar10] = pdVar2;
        dVar18 = B[uVar16];
        B[uVar16] = B[(int)uVar10];
        B[(int)uVar10] = dVar18;
      }
      if (uVar16 != uVar8) {
        for (uVar4 = 0; uVar17 != uVar4; uVar4 = uVar4 + 1) {
          pdVar2 = M[uVar4];
          dVar18 = pdVar2[uVar16];
          pdVar2[uVar16] = pdVar2[(int)uVar8];
          pdVar2[(int)uVar8] = dVar18;
        }
        iVar1 = memblock[uVar16];
        memblock[uVar16] = memblock[(int)uVar8];
        memblock[(int)uVar8] = iVar1;
      }
      pdVar2 = M[uVar16];
      dVar18 = pdVar2[uVar16];
      B[uVar16] = B[uVar16] * (1.0 / dVar18);
      for (lVar11 = lVar6; lVar12 = lVar7, iVar15 + (int)lVar11 < n; lVar11 = lVar11 + 1) {
        *(double *)((long)pdVar2 + lVar11 * 8 + lVar5) =
             *(double *)((long)pdVar2 + lVar11 * 8 + lVar5) * (1.0 / dVar18);
      }
      for (; (int)lVar12 < n; lVar12 = lVar12 + 1) {
        pdVar3 = M[lVar12];
        dVar18 = pdVar3[uVar16];
        dVar20 = -dVar18;
        if ((dVar18 != dVar20) || (NAN(dVar18) || NAN(dVar20))) {
          B[lVar12] = B[uVar16] * dVar20 + B[lVar12];
          for (lVar11 = lVar6; iVar15 + (int)lVar11 < n; lVar11 = lVar11 + 1) {
            *(double *)((long)pdVar3 + lVar11 * 8 + lVar5) =
                 *(double *)((long)pdVar2 + lVar11 * 8 + lVar5) * dVar20 +
                 *(double *)((long)pdVar3 + lVar11 * 8 + lVar5);
          }
        }
      }
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 8;
      dVar18 = dVar19;
    }
    while (0 < (long)uVar4) {
      uVar4 = uVar4 - 1;
      for (lVar6 = 0; lVar6 < (long)uVar4; lVar6 = lVar6 + 1) {
        dVar20 = M[lVar6][uVar4];
        if ((dVar20 != 0.0) || (NAN(dVar20))) {
          B[lVar6] = B[lVar6] - dVar20 * B[uVar4];
        }
      }
    }
    if (bFullPivot) {
      for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
        X[memblock[uVar16]] = B[uVar16];
      }
      if (memblock != Xdex_buffer && memblock != (int *)0x0) {
        onfree(memblock);
      }
    }
    else {
      memcpy(X,B,uVar17 << 3);
    }
    dVar18 = dVar18 / dVar21;
  }
  return dVar18;
}

Assistant:

double ON_SolveNxN(bool bFullPivot, bool bNormalize, int n, double* M[], double B[], double X[])
{
  if ( n <= 0 || 0 == M || 0 == B || 0 == X )
    return 0.0;

  int i,j,maxi,maxj,n0, Xdex_buffer[64];
  double x,minpivot=0.0,maxpivot=1.0,*p;
  int* Xdex = 0;
  
  if ( bNormalize )
  {
    for ( i = 0; i < n; i++ )
    {
      x = 0.0;
      for ( j = 0; j < n; j++ )
      {
        x += M[i][j]*M[i][j];
      }
      if ( x > 0.0 )
      {
        x = 1.0/sqrt(x);
        B[i] *= x;
        for ( j = 0; j < n; j++ )
          M[i][j] *= x;
      }
    }
  }

  if ( bFullPivot )
  {
    // The Xdex_buffer[] hoo haa is here to avoid an potentially time
    // consuming call to heap services when the matrix is small.
    // When n > 64 the numerical portion of the computation is 
    // long enough that the time to call onmalloc() is negligible.
    // (When n > 10-ish, this calculation is likely to return junk
    // unless you have a special case matrix, in which case this
    // function will be much slower than one that is designed to
    // takes advantage of the special case.
    Xdex = (n <= (int)((sizeof(Xdex_buffer)/sizeof(Xdex_buffer[0]))))
         ? &Xdex_buffer[0] 
         : (int*)onmalloc(n*sizeof(Xdex[0]));
    for ( i = 0; i < n; i++ )
      Xdex[i] = i;
  }

  // reduce system of equations to upper triangular
  for (n0=0; n0<n; n0++)
  {
    // find pivot = biggest entry in sub-matrix
    maxi=n0;
    maxj=n0;
    x=0.0;
    for(j=n0;j<n;j++) 
    {
      for(i=n0;i<n;i++)  
      {
        if ( fabs(M[i][j]) > x )
        {
          x=fabs(M[i][j]);
          maxi=i;
          maxj=j;
        }
      }
      if ( !bFullPivot )
        break;
    }
    if ( 0.0==x )
    {
      // system of equations is degenerate
      // Return -(rank of M) (M has rank n0)
      if ( 0 != Xdex && Xdex != &Xdex_buffer[0] )
        onfree(Xdex);
      return -n0;
    }
    else if ( 0==n0 )
    {
      minpivot=x;
      maxpivot=x;
    }
    else if (x < minpivot)
      minpivot=x;
    else if  (x > maxpivot)
      maxpivot=x;

    // put pivot in M[n0][n0]
    if ( n0 != maxi )
    {
      // swap rows n0 and maxi
      p = M[n0];M[n0]=M[maxi];M[maxi]=p;
      x=B[n0];B[n0]=B[maxi];B[maxi]=x;
    }
    if ( n0 != maxj )
    {
      // swap columns n0 and maxj
      for (i=0;i<n;i++)
      {
        x=M[i][n0];M[i][n0]=M[i][maxj];M[i][maxj]=x;
      }
      j=Xdex[n0];Xdex[n0]=Xdex[maxj];Xdex[maxj]=j;
    }

    // divide row n0 by M[n0][n0] to unitize M[n0][n0]
    x = 1.0/M[n0][n0];
    //M[n0][n0] = 1.0; // cosmetic because M[n0][n0] will never be used again
    B[n0] *= x;
    for (j=n0+1;j<n;j++) 
      M[n0][j] *= x;

    // For each i > n0, replace row[i] with
    // row[i] - M[i][n0]*row[n0] to zero out M[i>n0][n0]
    for ( i = n0+1; i < n; i++ )
    {
      x = -M[i][n0];
      if ( 0.0 != x )
      {
        //M[i][n0] = 0.0; // cosmetic because M[i][n0] will never be used again
        B[i] += x*B[n0];
        for ( j = n0+1; j < n; j++ )
        {
          M[i][j] += x*M[n0][j];
        }
      }
    }
  }

  // At this point M is upper triangular with 1's
  // on its diagonal.  Backsolve.
  for ( j = n-1; j >= 0; j-- )
  {
    for ( i = 0; i < j; i++ )
    {
      x = -M[i][j];
      if ( x != 0 )
      {
        B[i] += x*B[j];
        //M[i][j] += x; // cosmetic because M[i][j] will never be used again
      }
    }
  }

  // solution is now in B
  if ( bFullPivot )
  {
    for(i=0;i<n;i++)
      X[Xdex[i]] = B[i];

    if ( 0 != Xdex && Xdex != &Xdex_buffer[0] )
      onfree(Xdex);
  }
  else
  {
    memcpy(&X[0],&B[0],n*sizeof(X[0]));
  }

  return minpivot/maxpivot;
}